

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBinary
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
          ValueLength *length)

{
  ulong *puVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  Exception *this_00;
  ulong uVar5;
  ulong uVar6;
  
  pbVar4 = *(byte **)this;
  bVar2 = *pbVar4;
  if ((bVar2 & 0xf8) != 0xc0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,InvalidValueType,"Expecting type Binary");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  puVar1 = (ulong *)(pbVar4 + 1);
  switch(bVar2 + 1 & 0xf) {
  case 1:
    uVar5 = (ulong)(byte)*puVar1;
    break;
  case 2:
    uVar5 = (ulong)*(ushort *)(pbVar4 + 1);
    break;
  case 3:
    uVar5 = (ulong)pbVar4[1] | (ulong)((uint)pbVar4[2] << 8 | (uint)pbVar4[3] << 0x10);
    break;
  case 4:
    uVar5 = (ulong)*(uint *)(pbVar4 + 1);
    break;
  case 5:
    uVar3 = (uint)*puVar1;
    uVar5 = (ulong)pbVar4[5];
    goto LAB_00110e8b;
  case 6:
    uVar3 = (uint)*puVar1;
    uVar5 = (ulong)*(ushort *)(pbVar4 + 5);
LAB_00110e8b:
    uVar6 = (ulong)uVar3;
    uVar5 = uVar5 << 0x20;
LAB_00110ea4:
    uVar5 = uVar5 | uVar6;
    break;
  case 7:
    uVar6 = (ulong)*(uint3 *)(pbVar4 + 5) << 0x20;
    uVar5 = (ulong)(uint)*puVar1;
    goto LAB_00110ea4;
  case 8:
    uVar5 = *puVar1;
    break;
  default:
    uVar5 = 0;
  }
  *length = uVar5;
  return (byte *)((long)puVar1 + ((ulong)bVar2 - 0xbf));
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }